

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate(QAbstractFileEnginePrivate *this)

{
  void *in_RDI;
  
  ~QAbstractFileEnginePrivate((QAbstractFileEnginePrivate *)0x190eec);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate()
    = default;